

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saa1099_vb.c
# Opt level: O0

void saa_envgen_load(SAA_CHIP *saa,UINT8 genID)

{
  byte bVar1;
  SAA_ENV_GEN *pSVar2;
  UINT8 data;
  SAA_ENV_GEN *saaEGen;
  UINT8 genID_local;
  SAA_CHIP *saa_local;
  
  pSVar2 = saa->env + genID;
  bVar1 = saa->regs[(int)(genID | 0x18)];
  pSVar2->extClock = (byte)((int)(uint)bVar1 >> 5) & 1;
  pSVar2->wave = (byte)((int)(uint)bVar1 >> 1) & 7;
  pSVar2->invert = bVar1 & 1;
  pSVar2->pos = '\0';
  pSVar2->reload = '\0';
  if (pSVar2->enable == '\0') {
    pSVar2->flags = 0xc0;
    pSVar2->volR = '\x10';
    pSVar2->volL = '\x10';
  }
  return;
}

Assistant:

static void saa_envgen_load(SAA_CHIP* saa, UINT8 genID)
{
	SAA_ENV_GEN* saaEGen = &saa->env[genID];
	UINT8 data = saa->regs[0x18 | genID];
	
	saaEGen->extClock = (data >> 5) & 0x01;
	saaEGen->wave = (data >> 1) & 0x07;
	saaEGen->invert = (data >> 0) & 0x01;
	saaEGen->pos = 0x00;
	saaEGen->reload = 0;
	
	if (! saaEGen->enable)
	{
		saaEGen->flags = ENV_LOAD | ENV_STAY;
		saaEGen->volL = saaEGen->volR = 0x10;
	}
	
	return;
}